

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall DStrifeStatusBar::ShowPop(DStrifeStatusBar *this,int popnum)

{
  bool bVar1;
  int local_24;
  AInventory *pAStack_20;
  int i;
  AInventory *item;
  int popnum_local;
  DStrifeStatusBar *this_local;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  if (popnum == this->CurrentPop) {
    if (popnum == 2) {
      this->KeyPopPos = this->KeyPopPos + 10;
      this->KeyPopScroll = 0x118;
      pAStack_20 = ::TObjPtr::operator_cast_to_AInventory_
                             ((TObjPtr *)
                              &(((this->super_DBaseStatusBar).CPlayer)->mo->super_AActor).Inventory)
      ;
      local_24 = 0;
      for (; pAStack_20 != (AInventory *)0x0;
          pAStack_20 = ::TObjPtr::operator_cast_to_AInventory_
                                 ((TObjPtr *)&(pAStack_20->super_AActor).Inventory)) {
        bVar1 = DObject::IsKindOf((DObject *)pAStack_20,AKey::RegistrationInfo.MyClass);
        if (bVar1) {
          if (local_24 == this->KeyPopPos) {
            return;
          }
          local_24 = local_24 + 1;
        }
      }
    }
    this->PendingPop = 0;
    this->KeyPopScroll = 0;
    this->KeyPopPos = this->KeyPopPos + -10;
  }
  else {
    this->KeyPopPos = 0;
    this->PendingPop = popnum;
  }
  return;
}

Assistant:

void ShowPop (int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if (popnum == CurrentPop)
		{
			if (popnum == POP_Keys)
			{
				AInventory *item;
				int i;

				KeyPopPos += 10;
				KeyPopScroll = 280;

				for (item = CPlayer->mo->Inventory, i = 0;
					item != NULL;
					item = item->Inventory)
				{
					if (item->IsKindOf (RUNTIME_CLASS(AKey)))
					{
						if (i == KeyPopPos)
						{
							return;
						}
						i++;
					}
				}
			}
			PendingPop = POP_None;
			// Do not scroll keys horizontally when dropping the popscreen
			KeyPopScroll = 0;
			KeyPopPos -= 10;
		}
		else
		{
			KeyPopPos = 0;
			PendingPop = popnum;
		}
	}